

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O0

void dump_buffer_e(huff_entropy_ptr_conflict entropy)

{
  jpeg_destination_mgr *pjVar1;
  boolean bVar2;
  jpeg_destination_mgr *dest;
  huff_entropy_ptr_conflict entropy_local;
  
  pjVar1 = entropy->cinfo->dest;
  bVar2 = (*pjVar1->empty_output_buffer)(entropy->cinfo);
  if (bVar2 == 0) {
    entropy->cinfo->err->msg_code = 0x19;
    (*entropy->cinfo->err->error_exit)((j_common_ptr)entropy->cinfo);
  }
  entropy->next_output_byte = pjVar1->next_output_byte;
  entropy->free_in_buffer = pjVar1->free_in_buffer;
  return;
}

Assistant:

LOCAL(void)
dump_buffer_e (huff_entropy_ptr entropy)
/* Empty the output buffer; we do not support suspension in this case. */
{
  struct jpeg_destination_mgr * dest = entropy->cinfo->dest;

  if (! (*dest->empty_output_buffer) (entropy->cinfo))
    ERREXIT(entropy->cinfo, JERR_CANT_SUSPEND);
  /* After a successful buffer dump, must reset buffer pointers */
  entropy->next_output_byte = dest->next_output_byte;
  entropy->free_in_buffer = dest->free_in_buffer;
}